

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::fromUcs4(char32_t *unicode,qsizetype size)

{
  long lVar1;
  QByteArrayView ba;
  long in_RDX;
  wchar_t *in_RSI;
  EncodedData<QByteArrayView> *in_RDI;
  long in_FS_OFFSET;
  QStringDecoder toUtf16;
  undefined4 in_stack_ffffffffffffff48;
  Flag in_stack_ffffffffffffff4c;
  undefined4 uVar2;
  QFlagsStorage<QStringConverterBase::Flag> flags;
  QByteArrayView *in_stack_ffffffffffffff60;
  
  uVar2 = SUB84(in_RDI,0);
  flags.i = (Int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (wchar_t *)0x0) {
    QString((QString *)0x50a91a);
  }
  else {
    if (in_RDX < 0) {
      wcslen(in_RSI);
    }
    QFlags<QStringConverterBase::Flag>::QFlags
              ((QFlags<QStringConverterBase::Flag> *)in_RDI,in_stack_ffffffffffffff4c);
    QStringDecoder::QStringDecoder
              ((QStringDecoder *)in_RDI,in_stack_ffffffffffffff4c,(Flags)flags.i);
    QByteArrayView::QByteArrayView<char,_true>
              (in_stack_ffffffffffffff60,(char *)CONCAT44(flags.i,uVar2),(qsizetype)in_RDI);
    ba.m_data._0_4_ = uVar2;
    ba.m_size = (qsizetype)in_RDI;
    ba.m_data._4_4_ = flags.i;
    QStringDecoder::operator()
              ((QStringDecoder *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),ba);
    QStringDecoder::EncodedData::operator_cast_to_QString(in_RDI);
    QStringDecoder::~QStringDecoder((QStringDecoder *)0x50a9d6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)CONCAT44(flags.i,uVar2);
  }
  __stack_chk_fail();
}

Assistant:

QString QString::fromUcs4(const char32_t *unicode, qsizetype size)
{
    if (!unicode)
        return QString();
    if (size < 0) {
        if constexpr (sizeof(char32_t) == sizeof(wchar_t))
            size = wcslen(reinterpret_cast<const wchar_t *>(unicode));
        else
            size = std::char_traits<char32_t>::length(unicode);
    }
    QStringDecoder toUtf16(QStringDecoder::Utf32, QStringDecoder::Flag::Stateless);
    return toUtf16(QByteArrayView(reinterpret_cast<const char *>(unicode), size * 4));
}